

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::MultiFileReaderBindData>
          (Deserializer *this,field_id_t field_id,char *tag,MultiFileReaderBindData *ret)

{
  undefined6 in_register_00000032;
  type tStack_58;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  Read<duckdb::MultiFileReaderBindData>(&tStack_58,this);
  MultiFileReaderBindData::operator=(ret,&tStack_58);
  MultiFileReaderBindData::~MultiFileReaderBindData(&tStack_58);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}